

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall RealTrafficConnection::SendXPSimTime(RealTrafficConnection *this)

{
  bool bVar1;
  SimTimeCtrlTy SVar2;
  int iVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  longlong in_stack_00000008;
  RealTrafficConnection *in_stack_00000010;
  longlong ts;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  rep local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  rep local_10;
  
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_28);
  local_18.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_RDI);
  local_10 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_18);
  SVar2 = DataRefs::GetRTSTC(&dataRefs);
  if (SVar2 != STC_NO_CTRL) {
    if (SVar2 == STC_SIM_TIME_MANUALLY) {
      iVar3 = DataRefs::GetRTManTOfs(&dataRefs);
      local_10 = local_10 + (long)iVar3 * -60000;
    }
    else if ((SVar2 == STC_SIM_TIME_PLUS_BUFFER) &&
            (bVar1 = DataRefs::IsUsingSystemTime((DataRefs *)0x224d49), !bVar1)) {
      local_10 = DataRefs::GetXPSimTime_ms(&dataRefs);
      iVar3 = DataRefs::GetFdBufPeriod(&dataRefs);
      local_10 = (long)iVar3 * 1000 + local_10;
    }
  }
  SendTime(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void RealTrafficConnection::SendXPSimTime()
{
    // Which time stamp to send?
    long long ts = (long long)std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
    
    switch (dataRefs.GetRTSTC()) {
        case STC_NO_CTRL:                           // always use system time
            break;
            
        case STC_SIM_TIME_MANUALLY:                 // time offset configured manually: Just deduct from 'now'
            ts -= ((long long)dataRefs.GetRTManTOfs()) * 60000LL;
            break;
            
        case STC_SIM_TIME_PLUS_BUFFER:              // Simulated time
            if (!dataRefs.IsUsingSystemTime()) {    // not using system time:
                ts = dataRefs.GetXPSimTime_ms();    // send simulated time
                // add buffering period, so planes match up with simulator time exactly instead of being delayed
                ts += (long long)(dataRefs.GetFdBufPeriod()) * 1000LL;
            }
    }
    
    SendTime(ts);
}